

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O3

size_t derDec(u32 *tag,octet **val,size_t *len,octet *der,size_t count)

{
  size_t sVar1;
  size_t sVar2;
  size_t *len_00;
  size_t l;
  size_t sStack_28;
  
  len_00 = &sStack_28;
  if (len != (size_t *)0x0) {
    len_00 = len;
  }
  sVar1 = derTLDec(tag,len_00,der,count);
  sVar2 = 0xffffffffffffffff;
  if (((sVar1 != 0xffffffffffffffff) && (*len_00 + sVar1 <= count)) &&
     (sVar2 = *len_00 + sVar1, val != (octet **)0x0)) {
    *val = der + sVar1;
    sVar2 = *len_00 + sVar1;
  }
  return sVar2;
}

Assistant:

size_t derDec(u32* tag, const octet** val, size_t* len, const octet der[],
	size_t count)
{
	size_t l;
	size_t tl_count;
	// сделать len наверняка действительным
	if (!len)
		len = &l;
	// обработать TL
	tl_count = derTLDec(tag, len, der, count);
	if (tl_count == SIZE_MAX || tl_count + *len > count)
		return SIZE_MAX;
	// обработать V
	if (val)
	{
		ASSERT(memIsDisjoint2(val, sizeof(octet*), der, count));
		ASSERT(tag == 0 || memIsDisjoint2(val, sizeof(octet*), tag, 4));
		*val = der + tl_count;
	}
	// все нормально
	return tl_count + *len;
}